

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddTxPeginInput(void *handle,void *create_handle,char *txid,uint32_t vout,int64_t amount,
                      char *asset,char *mainchain_genesis_block_hash,char *claim_script,
                      char *mainchain_tx_hex,char *txout_proof)

{
  undefined8 uVar1;
  uint32_t in_ECX;
  char *in_RDX;
  long in_RSI;
  int64_t in_R8;
  char *in_R9;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  OutPoint outpoint;
  ConfidentialTransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  int result;
  Script *this;
  string *in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffab0;
  allocator *paVar2;
  bool *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  int network_type;
  string *prefix;
  void *in_stack_fffffffffffffba0;
  allocator local_449;
  string local_448;
  ByteData local_428;
  allocator local_409;
  string local_408 [16];
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  ConfidentialAssetId *in_stack_fffffffffffffc18;
  Amount *in_stack_fffffffffffffc20;
  OutPoint *in_stack_fffffffffffffc28;
  ConfidentialTransactionContext *in_stack_fffffffffffffc30;
  string local_3c8 [8];
  ByteData *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  Script local_3a8;
  allocator local_369;
  string local_368;
  BlockHash local_348;
  allocator local_321;
  string local_320;
  ConfidentialAssetId local_300;
  Amount local_2d8;
  allocator local_2c1;
  string local_2c0;
  Txid local_2a0;
  OutPoint local_280;
  undefined8 local_258;
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [37];
  byte local_1fb;
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [32];
  CfdSourceLocation local_1d8;
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  CfdSourceLocation local_198;
  undefined1 local_17a;
  allocator local_179;
  string local_178 [32];
  CfdSourceLocation local_158;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  undefined1 local_71 [53];
  undefined4 local_3c;
  char *local_38;
  int64_t local_30;
  uint32_t local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  network_type = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  prefix = (string *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_71 + 1),"TransactionData",(allocator *)prefix);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffba0,prefix);
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  local_80 = local_18;
  if (local_20 == (char *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0xb74;
    local_98.funcname = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>(&local_98,"txid is null.");
    local_ba = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_ba = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_38 == (char *)0x0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0xb7a;
    local_d8.funcname = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>(&local_d8,"asset is null.");
    local_fa = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Failed to parameter. asset is null.",&local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_fa = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000008 == (char *)0x0) {
    local_118.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_118.filename = local_118.filename + 1;
    local_118.line = 0xb80;
    local_118.funcname = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>(&local_118,"mainchain_genesis_block_hash is null.");
    local_13a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,"Failed to parameter. mainchain_genesis_block_hash is null.",&local_139);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_13a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000010 == (char *)0x0) {
    local_158.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_158.filename = local_158.filename + 1;
    local_158.line = 0xb86;
    local_158.funcname = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>(&local_158,"claim_script is null.");
    local_17a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"Failed to parameter. claim_script is null.",&local_179);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_17a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000018 == (char *)0x0) {
    local_198.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_198.filename = local_198.filename + 1;
    local_198.line = 0xb8c;
    local_198.funcname = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>(&local_198,"mainchain_tx_hex is null.");
    local_1ba = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b8,"Failed to parameter. mainchain_tx_hex is null.",&local_1b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_1ba = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000020 == (char *)0x0) {
    local_1d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_1d8.filename = local_1d8.filename + 1;
    local_1d8.line = 0xb92;
    local_1d8.funcname = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>(&local_1d8,"txout_proof is null.");
    local_1fa = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Failed to parameter. txout_proof is null.",&local_1f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_1fa = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_1fb = 0;
  cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffffae8);
  if (*(long *)(local_80 + 0x18) == 0) {
    local_222 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"Invalid handle state. tx is null",&local_221);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_222 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_1fb & 1) != 0) {
    local_24a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"Invalid handle state. tx is bitcoin.",&local_249);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffab0,error_code,in_stack_fffffffffffffaa0);
    local_24a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_258 = *(undefined8 *)(local_80 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,local_20,&local_2c1);
  cfd::core::Txid::Txid(&local_2a0,&local_2c0);
  cfd::core::OutPoint::OutPoint(&local_280,&local_2a0,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5c2551);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  cfd::core::Amount::Amount(&local_2d8,local_30);
  paVar2 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,local_38,paVar2);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_300,&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,in_stack_00000008,&local_369);
  cfd::core::BlockHash::BlockHash(&local_348,&local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,in_stack_00000010,(allocator *)&stack0xfffffffffffffc37);
  cfd::core::Script::Script(&local_3a8,(string *)local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,in_stack_00000018,&local_409);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xfffffffffffffc18,(string *)local_408);
  paVar2 = &local_449;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,in_stack_00000020,paVar2);
  cfd::core::ByteData::ByteData(&local_428,&local_448);
  this = (Script *)&local_428;
  cfd::ConfidentialTransactionContext::AddPeginTxIn
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
             in_stack_fffffffffffffc18,(BlockHash *)in_stack_fffffffffffffc10,
             (Script *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc40,
             (ByteData *)in_stack_fffffffffffffc48);
  cfd::core::ByteData::~ByteData((ByteData *)0x5c2775);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  cfd::core::ByteData::~ByteData((ByteData *)0x5c279c);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  cfd::core::Script::~Script(this);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc37);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x5c27ea);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5c2811);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  local_4 = 0;
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5c2843);
  return local_4;
}

Assistant:

int CfdAddTxPeginInput(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* asset,
    const char* mainchain_genesis_block_hash, const char* claim_script,
    const char* mainchain_tx_hex, const char* txout_proof) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (asset == nullptr) {
      warn(CFD_LOG_SOURCE, "asset is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null.");
    }
    if (mainchain_genesis_block_hash == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_genesis_block_hash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_genesis_block_hash is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (mainchain_tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_tx_hex is null.");
    }
    if (txout_proof == nullptr) {
      warn(CFD_LOG_SOURCE, "txout_proof is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txout_proof is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    tx->AddPeginTxIn(
        outpoint, Amount(amount), ConfidentialAssetId(asset),
        BlockHash(mainchain_genesis_block_hash), Script(claim_script),
        ByteData(mainchain_tx_hex), ByteData(txout_proof));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}